

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.h
# Opt level: O3

vector<float,_std::allocator<float>_> * __thiscall
mesh::createb(vector<float,_std::allocator<float>_> *__return_storage_ptr__,mesh *this,int r,int c,
             int m,vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                   *volt,
             vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *mcurrent)

{
  float fVar1;
  pointer pvVar2;
  pointer pvVar3;
  long lVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  allocator_type local_61 [21];
  value_type_conflict2 local_4c;
  vector<float,_std::allocator<float>_> local_48;
  
  (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_4c = 0.0;
  std::vector<float,_std::allocator<float>_>::vector(&local_48,(long)m,&local_4c,local_61);
  (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
  super__Vector_impl_data._M_start =
       local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
       _M_start;
  (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
  super__Vector_impl_data._M_finish =
       local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  if (2 < c) {
    uVar6 = 1;
    lVar8 = 4;
    do {
      if (0 < r) {
        pvVar2 = (mcurrent->
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        uVar7 = 0;
        do {
          pvVar3 = (volt->
                   super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          lVar4 = *(long *)&pvVar2[uVar7].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data;
          uVar9 = 0;
          do {
            if (*(int *)(lVar4 + lVar8 + uVar9 * 4) == 1) {
              fVar1 = *(float *)(*(long *)&pvVar3[uVar7].
                                           super__Vector_base<float,_std::allocator<float>_>._M_impl
                                           .super__Vector_impl_data + uVar9 * 4);
              if ((fVar1 != 0.0) || (NAN(fVar1))) {
                iVar5 = (int)((long)((ulong)(uint)((int)uVar6 >> 0x1f) << 0x20 | uVar6 & 0xffffffff)
                             / (long)r);
                local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start[iVar5] =
                     fVar1 + local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                             super__Vector_impl_data._M_start[iVar5];
              }
            }
            uVar9 = uVar9 + 1;
          } while ((uint)r != uVar9);
          uVar7 = uVar7 + 1;
        } while (uVar7 != (uint)r);
      }
      uVar6 = uVar6 + (long)(r + 1);
      lVar8 = lVar8 + (long)(r + 1) * 4;
    } while ((long)uVar6 < (long)(ulong)(c - 1));
  }
  return __return_storage_ptr__;
}

Assistant:

auto createb( int r, int c, int m, std::vector<std::vector<float>> &volt, std::vector<std::vector<int>> &mcurrent)
    {
        std::vector<float> b;
        int i, j, k;
      //  std::vector<float> b;
        //initialise b to 0
        b=std::vector<float> (m, 0);

        for(k = 1; k < c-1; k += r+1)
        {
            for(i = 0; i < r; i++)
            {
                for(j = 0; j < r; j++)
                {
                    if(mcurrent[i][j+k]== 1 && volt[i][j]!=0)
                    {
                        b[k/r]+= volt[i][j];
                    }
                   // std::cerr << mcurrent[i][j+k] << " and " << volt[i][j] << "\n";

//                    std::cerr << mcurrent[i][j+k] << " and " <<volt[i][j] << "\t";
//                    std::cerr << "\n";
                 //   std::cerr << b[k/r] << "\n";
                }
            }
        }
        return b;

    }